

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void server::enddemorecord(void)

{
  if (demorecord != (long *)0x0) {
    (**(code **)(*demorecord + 8))();
    demorecord = (long *)0x0;
    if (demotmp != (long *)0x0) {
      if ((maxdemos != 0) && (maxdemosize != 0)) {
        prunedemos(1);
        adddemo();
        return;
      }
      (**(code **)(*demotmp + 8))();
      demotmp = (long *)0x0;
    }
  }
  return;
}

Assistant:

void enddemorecord()
    {
        if(!demorecord) return;
        
        DELETEP(demorecord);
        
        if(!demotmp) return;
        if(!maxdemos || !maxdemosize) { DELETEP(demotmp); return; }
        
        prunedemos(1);
        adddemo();
    }